

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

Move MCTS::compute_move<NimState>(NimState root_state,ComputeOptions options)

{
  _Rb_tree_color _Var1;
  Node<NimState> *pNVar2;
  mapped_type *pmVar3;
  mapped_type_conflict *pmVar4;
  double dVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Rb_tree_color _Var8;
  int in_EDI;
  long lVar9;
  pointer ppNVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  Move best_move;
  int in_stack_00000008;
  byte in_stack_00000018;
  uint7 in_stack_00000019;
  int move;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  roots;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> visits;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  root_futures;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> wins;
  ComputeOptions job_options;
  vector<int,_std::allocator<int>_> moves;
  _Rb_tree_color local_134;
  double local_130;
  double local_128;
  double local_120;
  _Rb_tree_color local_114;
  double local_110;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  local_108;
  undefined1 local_e8 [8];
  _Rb_tree_node_base local_e0;
  size_t local_c0;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  local_b8;
  undefined1 local_a0 [8];
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_98;
  _Rb_tree_node_base local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  if (1 < in_EDI - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x17c);
  }
  NimState::get_moves(&local_48,(NimState *)local_a0);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    assertion_failed("moves.size() > 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x17f);
  }
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 4) {
    _Var8 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    goto LAB_0010a039;
  }
  local_b8.
  super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_left = (_Base_ptr)((ulong)in_stack_00000019 << 8);
  local_130 = (double)(long)in_stack_00000008;
  if ((long)local_130 < 1) {
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar11 = 0;
    do {
      local_e8._0_4_ = iVar11;
      local_e0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0;
      local_e0._M_parent = &local_68;
      std::async<MCTS::compute_move<NimState>(NimState,MCTS::ComputeOptions)::_lambda()_1_&>
                ((launch)(future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
                          *)(local_a0 + 8),(anon_class_24_3_cbaa58e5_for__M_head_impl *)0x1);
      std::
      vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
      ::
      emplace_back<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                ((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
                  *)&local_b8,
                 (future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
                  *)(local_a0 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                   local_98._M_impl.super__Rb_tree_header._M_header._M_color) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_98._M_impl.super__Rb_tree_header._M_header._M_color));
      }
      iVar11 = iVar11 + 1;
    } while (local_130._0_4_ != iVar11);
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < local_130._0_4_) {
      lVar9 = (long)local_130 << 4;
      lVar12 = 0;
      do {
        std::
        future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
        ::get((future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
               *)local_e8);
        std::
        vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
        ::
        emplace_back<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>
                  ((vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                    *)&local_108,
                   (unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_> *)
                   local_e8);
        pNVar2 = (Node<NimState> *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
        if (pNVar2 != (Node<NimState> *)0x0) {
          Node<NimState>::~Node(pNVar2);
          operator_delete(pNVar2);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar9 != lVar12);
    }
  }
  local_e0._M_left = &local_e0;
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  local_e0._M_parent = (_Base_ptr)0x0;
  local_c0 = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._M_right = local_e0._M_left;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_130._0_4_ < 1) {
    local_120 = 0.0;
LAB_00109e87:
    local_134 = _S_red;
    _Var8 = _S_red;
  }
  else {
    dVar13 = 0.0;
    dVar5 = 0.0;
    do {
      pNVar2 = local_108.
               super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar13]._M_t.
               super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
               .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
      local_120 = (double)(long)pNVar2->visits;
      local_110 = dVar5;
      for (ppNVar10 = *(pointer *)
                       &(pNVar2->children).
                        super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
                        ._M_impl;
          ppNVar10 !=
          *(pointer *)
           ((long)&(pNVar2->children).
                   super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
           + 8); ppNVar10 = ppNVar10 + 1) {
        iVar11 = (*ppNVar10)->visits;
        pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_e8,&(*ppNVar10)->move);
        *pmVar3 = *pmVar3 + iVar11;
        local_128 = (*ppNVar10)->wins;
        pmVar4 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)(local_a0 + 8),&(*ppNVar10)->move);
        *pmVar4 = local_128 + *pmVar4;
      }
      dVar5 = (double)((long)local_110 + (long)local_120);
      dVar13 = (double)((long)dVar13 + 1);
    } while (dVar13 != local_130);
    local_120 = (double)(long)dVar5;
    local_134 = _S_red;
    if (local_e0._M_left == &local_e0) goto LAB_00109e87;
    local_130 = -1.0;
    _Var8 = _S_red;
    p_Var7 = local_e0._M_left;
    do {
      _Var1 = p_Var7[1]._M_color;
      local_128 = (double)*(int *)&p_Var7[1].field_0x4;
      local_114 = _Var1;
      pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)(local_a0 + 8),(key_type *)&local_114);
      local_110 = *pmVar4;
      dVar5 = (local_110 + 1.0) / (local_128 + 2.0);
      if (local_130 < dVar5) {
        local_134 = local_114;
        _Var8 = local_114;
        local_130 = dVar5;
      }
      if ((in_stack_00000018 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Move: ",6);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,_Var1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
        lVar9 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = 2;
        lVar9 = *(long *)(lVar9 + -0x18);
        *(uint *)(poVar6 + lVar9 + 0x18) = *(uint *)(poVar6 + lVar9 + 0x18) & 0xffffff4f | 0x80;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar6,(int)((local_128 * 100.0) / local_120 + 0.5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% visits)",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
        lVar9 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = 2;
        lVar9 = *(long *)(lVar9 + -0x18);
        *(uint *)(poVar6 + lVar9 + 0x18) = *(uint *)(poVar6 + lVar9 + 0x18) & 0xffffff4f | 0x80;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar6,(int)((local_110 * 100.0) / local_128 + 0.5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% wins)",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != &local_e0);
  }
  if ((in_stack_00000018 & 1) != 0) {
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)(local_a0 + 8),(key_type *)&local_134);
    local_128 = *pmVar4;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_e8,(key_type *)&local_134);
    iVar11 = *pmVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"----",4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Best: ",6);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    local_130 = (double)iVar11;
    poVar6 = std::ostream::_M_insert<double>((local_130 * 100.0) / local_120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% visits)",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    poVar6 = std::ostream::_M_insert<double>((local_128 * 100.0) / local_130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% wins)",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    _Var8 = local_134;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)(local_a0 + 8));
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_e8);
  std::
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  ::~vector(&local_b8);
  if ((_Rb_tree_color *)
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start == (_Rb_tree_color *)0x0) {
    return _Var8;
  }
LAB_0010a039:
  operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return _Var8;
}

Assistant:

typename State::Move compute_move(const State root_state,
                                  const ComputeOptions options)
{
	using namespace std;

	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);

	auto moves = root_state.get_moves();
	attest(moves.size() > 0);
	if (moves.size() == 1) {
		return moves[0];
	}

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	#endif

	// Start all jobs to compute trees.
	vector<future<unique_ptr<Node<State>>>> root_futures;
	ComputeOptions job_options = options;
	job_options.verbose = false;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto func = [t, &root_state, &job_options] () -> std::unique_ptr<Node<State>>
		{
			return compute_tree(root_state, job_options, 1012411 * t + 12515);
		};

		root_futures.push_back(std::async(std::launch::async, func));
	}

	// Collect the results.
	vector<unique_ptr<Node<State>>> roots;
	for (int t = 0; t < options.number_of_threads; ++t) {
		roots.push_back(std::move(root_futures[t].get()));
	}

	// Merge the children of all root nodes.
	map<typename State::Move, int> visits;
	map<typename State::Move, double> wins;
	long long games_played = 0;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto root = roots[t].get();
		games_played += root->visits;
		for (auto child = root->children.cbegin(); child != root->children.cend(); ++child) {
			visits[(*child)->move] += (*child)->visits;
			wins[(*child)->move]   += (*child)->wins;
		}
	}

	// Find the node with the highest score.
	double best_score = -1;
	typename State::Move best_move = typename State::Move();
	for (auto itr: visits) {
		auto move = itr.first;
		double v = itr.second;
		double w = wins[move];
		// Expected success rate assuming a uniform prior (Beta(1, 1)).
		// https://en.wikipedia.org/wiki/Beta_distribution
		double expected_success_rate = (w + 1) / (v + 2);
		if (expected_success_rate > best_score) {
			best_move = move;
			best_score = expected_success_rate;
		}

		if (options.verbose) {
			cerr << "Move: " << itr.first
			     << " (" << setw(2) << right << int(100.0 * v / double(games_played) + 0.5) << "% visits)"
			     << " (" << setw(2) << right << int(100.0 * w / v + 0.5)    << "% wins)" << endl;
		}
	}

	if (options.verbose) {
		auto best_wins = wins[best_move];
		auto best_visits = visits[best_move];
		cerr << "----" << endl;
		cerr << "Best: " << best_move
		     << " (" << 100.0 * best_visits / double(games_played) << "% visits)"
		     << " (" << 100.0 * best_wins / best_visits << "% wins)" << endl;
	}

	#ifdef USE_OPENMP
	if (options.verbose) {
		double time = ::omp_get_wtime();
		std::cerr << games_played << " games played in " << double(time - start_time) << " s. "
		          << "(" << double(games_played) / (time - start_time) << " / second, "
		          << options.number_of_threads << " parallel jobs)." << endl;
	}
	#endif

	return best_move;
}